

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O0

bool __thiscall QHeaderViewPrivate::isRowSelected(QHeaderViewPrivate *this,int row)

{
  bool bVar1;
  QItemSelectionModel *pQVar2;
  uint in_ESI;
  long in_FS_OFFSET;
  byte local_39;
  QPersistentModelIndex local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x845c55);
  if (bVar1) {
    pQVar2 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x845c6c);
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_20);
    local_39 = QItemSelectionModel::isRowSelected((int)pQVar2,(QModelIndex *)(ulong)in_ESI);
  }
  else {
    local_39 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_39 & 1);
  }
  __stack_chk_fail();
}

Assistant:

inline bool isRowSelected(int row) const {
        return (selectionModel ? selectionModel->isRowSelected(row, root) : false);
    }